

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void hashblock(decaf_sha512_ctx_s *ctx)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong *in_RDI;
  uint64_t w15;
  uint64_t w14;
  uint64_t w13;
  uint64_t w12;
  uint64_t w11;
  uint64_t w10;
  uint64_t w9;
  uint64_t w8;
  uint64_t w7;
  uint64_t w6;
  uint64_t w5;
  uint64_t w4;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint64_t T2;
  uint64_t T1;
  uint64_t h;
  uint64_t g;
  uint64_t f;
  uint64_t e;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint8_t *in;
  
  uVar24 = *in_RDI;
  uVar22 = in_RDI[1];
  uVar20 = in_RDI[2];
  uVar18 = in_RDI[3];
  uVar25 = in_RDI[4];
  uVar23 = in_RDI[5];
  uVar21 = in_RDI[6];
  uVar19 = in_RDI[7];
  uVar1 = load_bigendian((uint8_t *)(in_RDI + 8));
  uVar2 = load_bigendian((uint8_t *)(in_RDI + 9));
  uVar3 = load_bigendian((uint8_t *)(in_RDI + 10));
  uVar4 = load_bigendian((uint8_t *)(in_RDI + 0xb));
  uVar5 = load_bigendian((uint8_t *)(in_RDI + 0xc));
  uVar6 = load_bigendian((uint8_t *)(in_RDI + 0xd));
  uVar7 = load_bigendian((uint8_t *)(in_RDI + 0xe));
  uVar8 = load_bigendian((uint8_t *)(in_RDI + 0xf));
  uVar9 = load_bigendian((uint8_t *)(in_RDI + 0x10));
  uVar10 = load_bigendian((uint8_t *)(in_RDI + 0x11));
  uVar11 = load_bigendian((uint8_t *)(in_RDI + 0x12));
  uVar12 = load_bigendian((uint8_t *)(in_RDI + 0x13));
  uVar13 = load_bigendian((uint8_t *)(in_RDI + 0x14));
  uVar14 = load_bigendian((uint8_t *)(in_RDI + 0x15));
  uVar15 = load_bigendian((uint8_t *)(in_RDI + 0x16));
  uVar16 = load_bigendian((uint8_t *)(in_RDI + 0x17));
  lVar17 = uVar19 + ((uVar25 >> 0xe | uVar25 << 0x32) ^ (uVar25 >> 0x12 | uVar25 << 0x2e) ^
                    (uVar25 >> 0x29 | uVar25 << 0x17)) +
           (uVar25 & uVar23 ^ (uVar25 ^ 0xffffffffffffffff) & uVar21) + 0x428a2f98d728ae22 + uVar1;
  uVar18 = uVar18 + lVar17;
  uVar19 = lVar17 + ((uVar24 >> 0x1c | uVar24 << 0x24) ^ (uVar24 >> 0x22 | uVar24 << 0x1e) ^
                    (uVar24 >> 0x27 | uVar24 << 0x19)) +
                    (uVar24 & uVar22 ^ uVar24 & uVar20 ^ uVar22 & uVar20);
  lVar17 = uVar21 + ((uVar18 >> 0xe | uVar18 << 0x32) ^ (uVar18 >> 0x12 | uVar18 << 0x2e) ^
                    (uVar18 >> 0x29 | uVar18 * 0x800000)) +
           (uVar18 & uVar25 ^ (uVar18 ^ 0xffffffffffffffff) & uVar23) + 0x7137449123ef65cd + uVar2;
  uVar20 = uVar20 + lVar17;
  uVar21 = lVar17 + ((uVar19 >> 0x1c | uVar19 << 0x24) ^ (uVar19 >> 0x22 | uVar19 * 0x40000000) ^
                    (uVar19 >> 0x27 | uVar19 * 0x2000000)) +
                    (uVar19 & uVar24 ^ uVar19 & uVar22 ^ uVar24 & uVar22);
  lVar17 = uVar23 + ((uVar20 >> 0xe | uVar20 << 0x32) ^ (uVar20 >> 0x12 | uVar20 << 0x2e) ^
                    (uVar20 >> 0x29 | uVar20 * 0x800000)) +
           (uVar20 & uVar18 ^ (uVar20 ^ 0xffffffffffffffff) & uVar25) + -0x4a3f043013b2c4d1 + uVar3;
  uVar22 = uVar22 + lVar17;
  uVar23 = lVar17 + ((uVar21 >> 0x1c | uVar21 << 0x24) ^ (uVar21 >> 0x22 | uVar21 * 0x40000000) ^
                    (uVar21 >> 0x27 | uVar21 * 0x2000000)) +
                    (uVar21 & uVar19 ^ uVar21 & uVar24 ^ uVar19 & uVar24);
  lVar17 = uVar25 + ((uVar22 >> 0xe | uVar22 << 0x32) ^ (uVar22 >> 0x12 | uVar22 << 0x2e) ^
                    (uVar22 >> 0x29 | uVar22 * 0x800000)) +
           (uVar22 & uVar20 ^ (uVar22 ^ 0xffffffffffffffff) & uVar18) + -0x164a245a7e762444 + uVar4;
  uVar24 = uVar24 + lVar17;
  uVar25 = lVar17 + ((uVar23 >> 0x1c | uVar23 << 0x24) ^ (uVar23 >> 0x22 | uVar23 * 0x40000000) ^
                    (uVar23 >> 0x27 | uVar23 * 0x2000000)) +
                    (uVar23 & uVar21 ^ uVar23 & uVar19 ^ uVar21 & uVar19);
  lVar17 = uVar18 + ((uVar24 >> 0xe | uVar24 << 0x32) ^ (uVar24 >> 0x12 | uVar24 << 0x2e) ^
                    (uVar24 >> 0x29 | uVar24 * 0x800000)) +
           (uVar24 & uVar22 ^ (uVar24 ^ 0xffffffffffffffff) & uVar20) + 0x3956c25bf348b538 + uVar5;
  uVar19 = uVar19 + lVar17;
  uVar18 = lVar17 + ((uVar25 >> 0x1c | uVar25 << 0x24) ^ (uVar25 >> 0x22 | uVar25 * 0x40000000) ^
                    (uVar25 >> 0x27 | uVar25 * 0x2000000)) +
                    (uVar25 & uVar23 ^ uVar25 & uVar21 ^ uVar23 & uVar21);
  lVar17 = uVar20 + ((uVar19 >> 0xe | uVar19 << 0x32) ^ (uVar19 >> 0x12 | uVar19 << 0x2e) ^
                    (uVar19 >> 0x29 | uVar19 * 0x800000)) +
           (uVar19 & uVar24 ^ (uVar19 ^ 0xffffffffffffffff) & uVar22) + 0x59f111f1b605d019 + uVar6;
  uVar21 = uVar21 + lVar17;
  uVar20 = lVar17 + ((uVar18 >> 0x1c | uVar18 << 0x24) ^ (uVar18 >> 0x22 | uVar18 * 0x40000000) ^
                    (uVar18 >> 0x27 | uVar18 * 0x2000000)) +
                    (uVar18 & uVar25 ^ uVar18 & uVar23 ^ uVar25 & uVar23);
  lVar17 = uVar22 + ((uVar21 >> 0xe | uVar21 << 0x32) ^ (uVar21 >> 0x12 | uVar21 << 0x2e) ^
                    (uVar21 >> 0x29 | uVar21 * 0x800000)) +
           (uVar21 & uVar19 ^ (uVar21 ^ 0xffffffffffffffff) & uVar24) + -0x6dc07d5b50e6b065 + uVar7;
  uVar23 = uVar23 + lVar17;
  uVar22 = lVar17 + ((uVar20 >> 0x1c | uVar20 << 0x24) ^ (uVar20 >> 0x22 | uVar20 * 0x40000000) ^
                    (uVar20 >> 0x27 | uVar20 * 0x2000000)) +
                    (uVar20 & uVar18 ^ uVar20 & uVar25 ^ uVar18 & uVar25);
  lVar17 = uVar24 + ((uVar23 >> 0xe | uVar23 << 0x32) ^ (uVar23 >> 0x12 | uVar23 << 0x2e) ^
                    (uVar23 >> 0x29 | uVar23 * 0x800000)) +
           (uVar23 & uVar21 ^ (uVar23 ^ 0xffffffffffffffff) & uVar19) + -0x54e3a12a25927ee8 + uVar8;
  uVar25 = uVar25 + lVar17;
  uVar24 = lVar17 + ((uVar22 >> 0x1c | uVar22 << 0x24) ^ (uVar22 >> 0x22 | uVar22 * 0x40000000) ^
                    (uVar22 >> 0x27 | uVar22 * 0x2000000)) +
                    (uVar22 & uVar20 ^ uVar22 & uVar18 ^ uVar20 & uVar18);
  lVar17 = uVar19 + ((uVar25 >> 0xe | uVar25 << 0x32) ^ (uVar25 >> 0x12 | uVar25 << 0x2e) ^
                    (uVar25 >> 0x29 | uVar25 * 0x800000)) +
           (uVar25 & uVar23 ^ (uVar25 ^ 0xffffffffffffffff) & uVar21) + -0x27f855675cfcfdbe + uVar9;
  uVar18 = uVar18 + lVar17;
  uVar19 = lVar17 + ((uVar24 >> 0x1c | uVar24 << 0x24) ^ (uVar24 >> 0x22 | uVar24 * 0x40000000) ^
                    (uVar24 >> 0x27 | uVar24 * 0x2000000)) +
                    (uVar24 & uVar22 ^ uVar24 & uVar20 ^ uVar22 & uVar20);
  lVar17 = uVar21 + ((uVar18 >> 0xe | uVar18 << 0x32) ^ (uVar18 >> 0x12 | uVar18 << 0x2e) ^
                    (uVar18 >> 0x29 | uVar18 * 0x800000)) +
           (uVar18 & uVar25 ^ (uVar18 ^ 0xffffffffffffffff) & uVar23) + 0x12835b0145706fbe + uVar10;
  uVar20 = uVar20 + lVar17;
  uVar21 = lVar17 + ((uVar19 >> 0x1c | uVar19 << 0x24) ^ (uVar19 >> 0x22 | uVar19 * 0x40000000) ^
                    (uVar19 >> 0x27 | uVar19 * 0x2000000)) +
                    (uVar19 & uVar24 ^ uVar19 & uVar22 ^ uVar24 & uVar22);
  lVar17 = uVar23 + ((uVar20 >> 0xe | uVar20 << 0x32) ^ (uVar20 >> 0x12 | uVar20 << 0x2e) ^
                    (uVar20 >> 0x29 | uVar20 * 0x800000)) +
           (uVar20 & uVar18 ^ (uVar20 ^ 0xffffffffffffffff) & uVar25) + 0x243185be4ee4b28c + uVar11;
  uVar22 = uVar22 + lVar17;
  uVar23 = lVar17 + ((uVar21 >> 0x1c | uVar21 << 0x24) ^ (uVar21 >> 0x22 | uVar21 * 0x40000000) ^
                    (uVar21 >> 0x27 | uVar21 * 0x2000000)) +
                    (uVar21 & uVar19 ^ uVar21 & uVar24 ^ uVar19 & uVar24);
  lVar17 = uVar25 + ((uVar22 >> 0xe | uVar22 << 0x32) ^ (uVar22 >> 0x12 | uVar22 << 0x2e) ^
                    (uVar22 >> 0x29 | uVar22 * 0x800000)) +
           (uVar22 & uVar20 ^ (uVar22 ^ 0xffffffffffffffff) & uVar18) + 0x550c7dc3d5ffb4e2 + uVar12;
  uVar24 = uVar24 + lVar17;
  uVar25 = lVar17 + ((uVar23 >> 0x1c | uVar23 << 0x24) ^ (uVar23 >> 0x22 | uVar23 * 0x40000000) ^
                    (uVar23 >> 0x27 | uVar23 * 0x2000000)) +
                    (uVar23 & uVar21 ^ uVar23 & uVar19 ^ uVar21 & uVar19);
  lVar17 = uVar18 + ((uVar24 >> 0xe | uVar24 << 0x32) ^ (uVar24 >> 0x12 | uVar24 << 0x2e) ^
                    (uVar24 >> 0x29 | uVar24 * 0x800000)) +
           (uVar24 & uVar22 ^ (uVar24 ^ 0xffffffffffffffff) & uVar20) + 0x72be5d74f27b896f + uVar13;
  uVar19 = uVar19 + lVar17;
  uVar18 = lVar17 + ((uVar25 >> 0x1c | uVar25 << 0x24) ^ (uVar25 >> 0x22 | uVar25 * 0x40000000) ^
                    (uVar25 >> 0x27 | uVar25 * 0x2000000)) +
                    (uVar25 & uVar23 ^ uVar25 & uVar21 ^ uVar23 & uVar21);
  lVar17 = uVar20 + ((uVar19 >> 0xe | uVar19 << 0x32) ^ (uVar19 >> 0x12 | uVar19 << 0x2e) ^
                    (uVar19 >> 0x29 | uVar19 * 0x800000)) +
           (uVar19 & uVar24 ^ (uVar19 ^ 0xffffffffffffffff) & uVar22) + -0x7f214e01c4e9694f + uVar14
  ;
  uVar21 = uVar21 + lVar17;
  uVar20 = lVar17 + ((uVar18 >> 0x1c | uVar18 << 0x24) ^ (uVar18 >> 0x22 | uVar18 * 0x40000000) ^
                    (uVar18 >> 0x27 | uVar18 * 0x2000000)) +
                    (uVar18 & uVar25 ^ uVar18 & uVar23 ^ uVar25 & uVar23);
  lVar17 = uVar22 + ((uVar21 >> 0xe | uVar21 << 0x32) ^ (uVar21 >> 0x12 | uVar21 << 0x2e) ^
                    (uVar21 >> 0x29 | uVar21 * 0x800000)) +
           (uVar21 & uVar19 ^ (uVar21 ^ 0xffffffffffffffff) & uVar24) + -0x6423f958da38edcb + uVar15
  ;
  uVar23 = uVar23 + lVar17;
  uVar22 = lVar17 + ((uVar20 >> 0x1c | uVar20 << 0x24) ^ (uVar20 >> 0x22 | uVar20 * 0x40000000) ^
                    (uVar20 >> 0x27 | uVar20 * 0x2000000)) +
                    (uVar20 & uVar18 ^ uVar20 & uVar25 ^ uVar18 & uVar25);
  lVar17 = uVar24 + ((uVar23 >> 0xe | uVar23 << 0x32) ^ (uVar23 >> 0x12 | uVar23 << 0x2e) ^
                    (uVar23 >> 0x29 | uVar23 * 0x800000)) +
           (uVar23 & uVar21 ^ (uVar23 ^ 0xffffffffffffffff) & uVar19) + -0x3e640e8b3096d96c + uVar16
  ;
  uVar25 = uVar25 + lVar17;
  uVar24 = lVar17 + ((uVar22 >> 0x1c | uVar22 << 0x24) ^ (uVar22 >> 0x22 | uVar22 * 0x40000000) ^
                    (uVar22 >> 0x27 | uVar22 * 0x2000000)) +
                    (uVar22 & uVar20 ^ uVar22 & uVar18 ^ uVar20 & uVar18);
  uVar26 = ((uVar15 >> 0x13 | uVar15 << 0x2d) ^ (uVar15 >> 0x3d | uVar15 << 3) ^ uVar15 >> 6) +
           uVar10 + ((uVar2 >> 1 | uVar2 << 0x3f) ^ (uVar2 >> 8 | uVar2 << 0x38) ^ uVar2 >> 7) +
           uVar1;
  uVar27 = ((uVar16 >> 0x13 | uVar16 << 0x2d) ^ (uVar16 >> 0x3d | uVar16 << 3) ^ uVar16 >> 6) +
           uVar11 + ((uVar3 >> 1 | uVar3 << 0x3f) ^ (uVar3 >> 8 | uVar3 << 0x38) ^ uVar3 >> 7) +
           uVar2;
  uVar28 = ((uVar26 >> 0x13 | uVar26 << 0x2d) ^ (uVar26 >> 0x3d | uVar26 * 8) ^ uVar26 >> 6) +
           uVar12 + ((uVar4 >> 1 | uVar4 << 0x3f) ^ (uVar4 >> 8 | uVar4 << 0x38) ^ uVar4 >> 7) +
           uVar3;
  uVar29 = ((uVar27 >> 0x13 | uVar27 << 0x2d) ^ (uVar27 >> 0x3d | uVar27 * 8) ^ uVar27 >> 6) +
           uVar13 + ((uVar5 >> 1 | uVar5 << 0x3f) ^ (uVar5 >> 8 | uVar5 << 0x38) ^ uVar5 >> 7) +
           uVar4;
  uVar30 = ((uVar28 >> 0x13 | uVar28 << 0x2d) ^ (uVar28 >> 0x3d | uVar28 * 8) ^ uVar28 >> 6) +
           uVar14 + ((uVar6 >> 1 | uVar6 << 0x3f) ^ (uVar6 >> 8 | uVar6 << 0x38) ^ uVar6 >> 7) +
           uVar5;
  uVar31 = ((uVar29 >> 0x13 | uVar29 << 0x2d) ^ (uVar29 >> 0x3d | uVar29 * 8) ^ uVar29 >> 6) +
           uVar15 + ((uVar7 >> 1 | uVar7 << 0x3f) ^ (uVar7 >> 8 | uVar7 << 0x38) ^ uVar7 >> 7) +
           uVar6;
  uVar32 = ((uVar30 >> 0x13 | uVar30 << 0x2d) ^ (uVar30 >> 0x3d | uVar30 * 8) ^ uVar30 >> 6) +
           uVar16 + ((uVar8 >> 1 | uVar8 << 0x3f) ^ (uVar8 >> 8 | uVar8 << 0x38) ^ uVar8 >> 7) +
           uVar7;
  uVar33 = ((uVar31 >> 0x13 | uVar31 << 0x2d) ^ (uVar31 >> 0x3d | uVar31 * 8) ^ uVar31 >> 6) +
           uVar26 + ((uVar9 >> 1 | uVar9 << 0x3f) ^ (uVar9 >> 8 | uVar9 << 0x38) ^ uVar9 >> 7) +
           uVar8;
  uVar34 = ((uVar32 >> 0x13 | uVar32 << 0x2d) ^ (uVar32 >> 0x3d | uVar32 * 8) ^ uVar32 >> 6) +
           uVar27 + ((uVar10 >> 1 | uVar10 << 0x3f) ^ (uVar10 >> 8 | uVar10 << 0x38) ^ uVar10 >> 7)
           + uVar9;
  uVar35 = ((uVar33 >> 0x13 | uVar33 << 0x2d) ^ (uVar33 >> 0x3d | uVar33 * 8) ^ uVar33 >> 6) +
           uVar28 + ((uVar11 >> 1 | uVar11 << 0x3f) ^ (uVar11 >> 8 | uVar11 << 0x38) ^ uVar11 >> 7)
           + uVar10;
  uVar36 = ((uVar34 >> 0x13 | uVar34 << 0x2d) ^ (uVar34 >> 0x3d | uVar34 * 8) ^ uVar34 >> 6) +
           uVar29 + ((uVar12 >> 1 | uVar12 << 0x3f) ^ (uVar12 >> 8 | uVar12 << 0x38) ^ uVar12 >> 7)
           + uVar11;
  uVar37 = ((uVar35 >> 0x13 | uVar35 << 0x2d) ^ (uVar35 >> 0x3d | uVar35 * 8) ^ uVar35 >> 6) +
           uVar30 + ((uVar13 >> 1 | uVar13 << 0x3f) ^ (uVar13 >> 8 | uVar13 << 0x38) ^ uVar13 >> 7)
           + uVar12;
  uVar38 = ((uVar36 >> 0x13 | uVar36 << 0x2d) ^ (uVar36 >> 0x3d | uVar36 * 8) ^ uVar36 >> 6) +
           uVar31 + ((uVar14 >> 1 | uVar14 << 0x3f) ^ (uVar14 >> 8 | uVar14 << 0x38) ^ uVar14 >> 7)
           + uVar13;
  uVar39 = ((uVar37 >> 0x13 | uVar37 << 0x2d) ^ (uVar37 >> 0x3d | uVar37 * 8) ^ uVar37 >> 6) +
           uVar32 + ((uVar15 >> 1 | uVar15 << 0x3f) ^ (uVar15 >> 8 | uVar15 << 0x38) ^ uVar15 >> 7)
           + uVar14;
  uVar40 = ((uVar38 >> 0x13 | uVar38 << 0x2d) ^ (uVar38 >> 0x3d | uVar38 * 8) ^ uVar38 >> 6) +
           uVar33 + ((uVar16 >> 1 | uVar16 << 0x3f) ^ (uVar16 >> 8 | uVar16 << 0x38) ^ uVar16 >> 7)
           + uVar15;
  uVar41 = ((uVar39 >> 0x13 | uVar39 << 0x2d) ^ (uVar39 >> 0x3d | uVar39 * 8) ^ uVar39 >> 6) +
           uVar34 + ((uVar26 >> 1 | uVar26 << 0x3f) ^ (uVar26 >> 8 | uVar26 << 0x38) ^ uVar26 >> 7)
           + uVar16;
  lVar17 = uVar19 + ((uVar25 >> 0xe | uVar25 << 0x32) ^ (uVar25 >> 0x12 | uVar25 << 0x2e) ^
                    (uVar25 >> 0x29 | uVar25 * 0x800000)) +
           (uVar25 & uVar23 ^ (uVar25 ^ 0xffffffffffffffff) & uVar21) + -0x1b64963e610eb52e + uVar26
  ;
  uVar18 = uVar18 + lVar17;
  uVar19 = lVar17 + ((uVar24 >> 0x1c | uVar24 << 0x24) ^ (uVar24 >> 0x22 | uVar24 * 0x40000000) ^
                    (uVar24 >> 0x27 | uVar24 * 0x2000000)) +
                    (uVar24 & uVar22 ^ uVar24 & uVar20 ^ uVar22 & uVar20);
  lVar17 = uVar21 + ((uVar18 >> 0xe | uVar18 << 0x32) ^ (uVar18 >> 0x12 | uVar18 << 0x2e) ^
                    (uVar18 >> 0x29 | uVar18 * 0x800000)) +
           (uVar18 & uVar25 ^ (uVar18 ^ 0xffffffffffffffff) & uVar23) + -0x1041b879c7b0da1d + uVar27
  ;
  uVar20 = uVar20 + lVar17;
  uVar21 = lVar17 + ((uVar19 >> 0x1c | uVar19 << 0x24) ^ (uVar19 >> 0x22 | uVar19 * 0x40000000) ^
                    (uVar19 >> 0x27 | uVar19 * 0x2000000)) +
                    (uVar19 & uVar24 ^ uVar19 & uVar22 ^ uVar24 & uVar22);
  lVar17 = uVar23 + ((uVar20 >> 0xe | uVar20 << 0x32) ^ (uVar20 >> 0x12 | uVar20 << 0x2e) ^
                    (uVar20 >> 0x29 | uVar20 * 0x800000)) +
           (uVar20 & uVar18 ^ (uVar20 ^ 0xffffffffffffffff) & uVar25) + 0xfc19dc68b8cd5b5 + uVar28;
  uVar22 = uVar22 + lVar17;
  uVar23 = lVar17 + ((uVar21 >> 0x1c | uVar21 << 0x24) ^ (uVar21 >> 0x22 | uVar21 * 0x40000000) ^
                    (uVar21 >> 0x27 | uVar21 * 0x2000000)) +
                    (uVar21 & uVar19 ^ uVar21 & uVar24 ^ uVar19 & uVar24);
  lVar17 = uVar25 + ((uVar22 >> 0xe | uVar22 << 0x32) ^ (uVar22 >> 0x12 | uVar22 << 0x2e) ^
                    (uVar22 >> 0x29 | uVar22 * 0x800000)) +
           (uVar22 & uVar20 ^ (uVar22 ^ 0xffffffffffffffff) & uVar18) + 0x240ca1cc77ac9c65 + uVar29;
  uVar24 = uVar24 + lVar17;
  uVar25 = lVar17 + ((uVar23 >> 0x1c | uVar23 << 0x24) ^ (uVar23 >> 0x22 | uVar23 * 0x40000000) ^
                    (uVar23 >> 0x27 | uVar23 * 0x2000000)) +
                    (uVar23 & uVar21 ^ uVar23 & uVar19 ^ uVar21 & uVar19);
  lVar17 = uVar18 + ((uVar24 >> 0xe | uVar24 << 0x32) ^ (uVar24 >> 0x12 | uVar24 << 0x2e) ^
                    (uVar24 >> 0x29 | uVar24 * 0x800000)) +
           (uVar24 & uVar22 ^ (uVar24 ^ 0xffffffffffffffff) & uVar20) + 0x2de92c6f592b0275 + uVar30;
  uVar19 = uVar19 + lVar17;
  uVar18 = lVar17 + ((uVar25 >> 0x1c | uVar25 << 0x24) ^ (uVar25 >> 0x22 | uVar25 * 0x40000000) ^
                    (uVar25 >> 0x27 | uVar25 * 0x2000000)) +
                    (uVar25 & uVar23 ^ uVar25 & uVar21 ^ uVar23 & uVar21);
  lVar17 = uVar20 + ((uVar19 >> 0xe | uVar19 << 0x32) ^ (uVar19 >> 0x12 | uVar19 << 0x2e) ^
                    (uVar19 >> 0x29 | uVar19 * 0x800000)) +
           (uVar19 & uVar24 ^ (uVar19 ^ 0xffffffffffffffff) & uVar22) + 0x4a7484aa6ea6e483 + uVar31;
  uVar21 = uVar21 + lVar17;
  uVar20 = lVar17 + ((uVar18 >> 0x1c | uVar18 << 0x24) ^ (uVar18 >> 0x22 | uVar18 * 0x40000000) ^
                    (uVar18 >> 0x27 | uVar18 * 0x2000000)) +
                    (uVar18 & uVar25 ^ uVar18 & uVar23 ^ uVar25 & uVar23);
  lVar17 = uVar22 + ((uVar21 >> 0xe | uVar21 << 0x32) ^ (uVar21 >> 0x12 | uVar21 << 0x2e) ^
                    (uVar21 >> 0x29 | uVar21 * 0x800000)) +
           (uVar21 & uVar19 ^ (uVar21 ^ 0xffffffffffffffff) & uVar24) + 0x5cb0a9dcbd41fbd4 + uVar32;
  uVar23 = uVar23 + lVar17;
  uVar22 = lVar17 + ((uVar20 >> 0x1c | uVar20 << 0x24) ^ (uVar20 >> 0x22 | uVar20 * 0x40000000) ^
                    (uVar20 >> 0x27 | uVar20 * 0x2000000)) +
                    (uVar20 & uVar18 ^ uVar20 & uVar25 ^ uVar18 & uVar25);
  lVar17 = uVar24 + ((uVar23 >> 0xe | uVar23 << 0x32) ^ (uVar23 >> 0x12 | uVar23 << 0x2e) ^
                    (uVar23 >> 0x29 | uVar23 * 0x800000)) +
           (uVar23 & uVar21 ^ (uVar23 ^ 0xffffffffffffffff) & uVar19) + 0x76f988da831153b5 + uVar33;
  uVar25 = uVar25 + lVar17;
  uVar24 = lVar17 + ((uVar22 >> 0x1c | uVar22 << 0x24) ^ (uVar22 >> 0x22 | uVar22 * 0x40000000) ^
                    (uVar22 >> 0x27 | uVar22 * 0x2000000)) +
                    (uVar22 & uVar20 ^ uVar22 & uVar18 ^ uVar20 & uVar18);
  lVar17 = uVar19 + ((uVar25 >> 0xe | uVar25 << 0x32) ^ (uVar25 >> 0x12 | uVar25 << 0x2e) ^
                    (uVar25 >> 0x29 | uVar25 * 0x800000)) +
           (uVar25 & uVar23 ^ (uVar25 ^ 0xffffffffffffffff) & uVar21) + -0x67c1aead11992055 + uVar34
  ;
  uVar18 = uVar18 + lVar17;
  uVar19 = lVar17 + ((uVar24 >> 0x1c | uVar24 << 0x24) ^ (uVar24 >> 0x22 | uVar24 * 0x40000000) ^
                    (uVar24 >> 0x27 | uVar24 * 0x2000000)) +
                    (uVar24 & uVar22 ^ uVar24 & uVar20 ^ uVar22 & uVar20);
  lVar17 = uVar21 + ((uVar18 >> 0xe | uVar18 << 0x32) ^ (uVar18 >> 0x12 | uVar18 << 0x2e) ^
                    (uVar18 >> 0x29 | uVar18 * 0x800000)) +
           (uVar18 & uVar25 ^ (uVar18 ^ 0xffffffffffffffff) & uVar23) + -0x57ce3992d24bcdf0 + uVar35
  ;
  uVar20 = uVar20 + lVar17;
  uVar21 = lVar17 + ((uVar19 >> 0x1c | uVar19 << 0x24) ^ (uVar19 >> 0x22 | uVar19 * 0x40000000) ^
                    (uVar19 >> 0x27 | uVar19 * 0x2000000)) +
                    (uVar19 & uVar24 ^ uVar19 & uVar22 ^ uVar24 & uVar22);
  lVar17 = uVar23 + ((uVar20 >> 0xe | uVar20 << 0x32) ^ (uVar20 >> 0x12 | uVar20 << 0x2e) ^
                    (uVar20 >> 0x29 | uVar20 * 0x800000)) +
           (uVar20 & uVar18 ^ (uVar20 ^ 0xffffffffffffffff) & uVar25) + -0x4ffcd8376704dec1 + uVar36
  ;
  uVar22 = uVar22 + lVar17;
  uVar23 = lVar17 + ((uVar21 >> 0x1c | uVar21 << 0x24) ^ (uVar21 >> 0x22 | uVar21 * 0x40000000) ^
                    (uVar21 >> 0x27 | uVar21 * 0x2000000)) +
                    (uVar21 & uVar19 ^ uVar21 & uVar24 ^ uVar19 & uVar24);
  lVar17 = uVar25 + ((uVar22 >> 0xe | uVar22 << 0x32) ^ (uVar22 >> 0x12 | uVar22 << 0x2e) ^
                    (uVar22 >> 0x29 | uVar22 * 0x800000)) +
           (uVar22 & uVar20 ^ (uVar22 ^ 0xffffffffffffffff) & uVar18) + -0x40a680384110f11c + uVar37
  ;
  uVar24 = uVar24 + lVar17;
  uVar25 = lVar17 + ((uVar23 >> 0x1c | uVar23 << 0x24) ^ (uVar23 >> 0x22 | uVar23 * 0x40000000) ^
                    (uVar23 >> 0x27 | uVar23 * 0x2000000)) +
                    (uVar23 & uVar21 ^ uVar23 & uVar19 ^ uVar21 & uVar19);
  lVar17 = uVar18 + ((uVar24 >> 0xe | uVar24 << 0x32) ^ (uVar24 >> 0x12 | uVar24 << 0x2e) ^
                    (uVar24 >> 0x29 | uVar24 * 0x800000)) +
           (uVar24 & uVar22 ^ (uVar24 ^ 0xffffffffffffffff) & uVar20) + -0x391ff40cc257703e + uVar38
  ;
  uVar19 = uVar19 + lVar17;
  uVar18 = lVar17 + ((uVar25 >> 0x1c | uVar25 << 0x24) ^ (uVar25 >> 0x22 | uVar25 * 0x40000000) ^
                    (uVar25 >> 0x27 | uVar25 * 0x2000000)) +
                    (uVar25 & uVar23 ^ uVar25 & uVar21 ^ uVar23 & uVar21);
  lVar17 = uVar20 + ((uVar19 >> 0xe | uVar19 << 0x32) ^ (uVar19 >> 0x12 | uVar19 << 0x2e) ^
                    (uVar19 >> 0x29 | uVar19 * 0x800000)) +
           (uVar19 & uVar24 ^ (uVar19 ^ 0xffffffffffffffff) & uVar22) + -0x2a586eb86cf558db + uVar39
  ;
  uVar21 = uVar21 + lVar17;
  uVar20 = lVar17 + ((uVar18 >> 0x1c | uVar18 << 0x24) ^ (uVar18 >> 0x22 | uVar18 * 0x40000000) ^
                    (uVar18 >> 0x27 | uVar18 * 0x2000000)) +
                    (uVar18 & uVar25 ^ uVar18 & uVar23 ^ uVar25 & uVar23);
  lVar17 = uVar22 + ((uVar21 >> 0xe | uVar21 << 0x32) ^ (uVar21 >> 0x12 | uVar21 << 0x2e) ^
                    (uVar21 >> 0x29 | uVar21 * 0x800000)) +
           (uVar21 & uVar19 ^ (uVar21 ^ 0xffffffffffffffff) & uVar24) + 0x6ca6351e003826f + uVar40;
  uVar23 = uVar23 + lVar17;
  uVar22 = lVar17 + ((uVar20 >> 0x1c | uVar20 << 0x24) ^ (uVar20 >> 0x22 | uVar20 * 0x40000000) ^
                    (uVar20 >> 0x27 | uVar20 * 0x2000000)) +
                    (uVar20 & uVar18 ^ uVar20 & uVar25 ^ uVar18 & uVar25);
  lVar17 = uVar24 + ((uVar23 >> 0xe | uVar23 << 0x32) ^ (uVar23 >> 0x12 | uVar23 << 0x2e) ^
                    (uVar23 >> 0x29 | uVar23 * 0x800000)) +
           (uVar23 & uVar21 ^ (uVar23 ^ 0xffffffffffffffff) & uVar19) + 0x142929670a0e6e70 + uVar41;
  uVar25 = uVar25 + lVar17;
  uVar24 = lVar17 + ((uVar22 >> 0x1c | uVar22 << 0x24) ^ (uVar22 >> 0x22 | uVar22 * 0x40000000) ^
                    (uVar22 >> 0x27 | uVar22 * 0x2000000)) +
                    (uVar22 & uVar20 ^ uVar22 & uVar18 ^ uVar20 & uVar18);
  uVar26 = ((uVar40 >> 0x13 | uVar40 << 0x2d) ^ (uVar40 >> 0x3d | uVar40 * 8) ^ uVar40 >> 6) +
           uVar35 + ((uVar27 >> 1 | uVar27 << 0x3f) ^ (uVar27 >> 8 | uVar27 << 0x38) ^ uVar27 >> 7)
           + uVar26;
  uVar27 = ((uVar41 >> 0x13 | uVar41 << 0x2d) ^ (uVar41 >> 0x3d | uVar41 * 8) ^ uVar41 >> 6) +
           uVar36 + ((uVar28 >> 1 | uVar28 << 0x3f) ^ (uVar28 >> 8 | uVar28 << 0x38) ^ uVar28 >> 7)
           + uVar27;
  uVar28 = ((uVar26 >> 0x13 | uVar26 << 0x2d) ^ (uVar26 >> 0x3d | uVar26 * 8) ^ uVar26 >> 6) +
           uVar37 + ((uVar29 >> 1 | uVar29 << 0x3f) ^ (uVar29 >> 8 | uVar29 << 0x38) ^ uVar29 >> 7)
           + uVar28;
  uVar29 = ((uVar27 >> 0x13 | uVar27 << 0x2d) ^ (uVar27 >> 0x3d | uVar27 * 8) ^ uVar27 >> 6) +
           uVar38 + ((uVar30 >> 1 | uVar30 << 0x3f) ^ (uVar30 >> 8 | uVar30 << 0x38) ^ uVar30 >> 7)
           + uVar29;
  uVar30 = ((uVar28 >> 0x13 | uVar28 << 0x2d) ^ (uVar28 >> 0x3d | uVar28 * 8) ^ uVar28 >> 6) +
           uVar39 + ((uVar31 >> 1 | uVar31 << 0x3f) ^ (uVar31 >> 8 | uVar31 << 0x38) ^ uVar31 >> 7)
           + uVar30;
  uVar31 = ((uVar29 >> 0x13 | uVar29 << 0x2d) ^ (uVar29 >> 0x3d | uVar29 * 8) ^ uVar29 >> 6) +
           uVar40 + ((uVar32 >> 1 | uVar32 << 0x3f) ^ (uVar32 >> 8 | uVar32 << 0x38) ^ uVar32 >> 7)
           + uVar31;
  uVar32 = ((uVar30 >> 0x13 | uVar30 << 0x2d) ^ (uVar30 >> 0x3d | uVar30 * 8) ^ uVar30 >> 6) +
           uVar41 + ((uVar33 >> 1 | uVar33 << 0x3f) ^ (uVar33 >> 8 | uVar33 << 0x38) ^ uVar33 >> 7)
           + uVar32;
  uVar33 = ((uVar31 >> 0x13 | uVar31 << 0x2d) ^ (uVar31 >> 0x3d | uVar31 * 8) ^ uVar31 >> 6) +
           uVar26 + ((uVar34 >> 1 | uVar34 << 0x3f) ^ (uVar34 >> 8 | uVar34 << 0x38) ^ uVar34 >> 7)
           + uVar33;
  uVar34 = ((uVar32 >> 0x13 | uVar32 << 0x2d) ^ (uVar32 >> 0x3d | uVar32 * 8) ^ uVar32 >> 6) +
           uVar27 + ((uVar35 >> 1 | uVar35 << 0x3f) ^ (uVar35 >> 8 | uVar35 << 0x38) ^ uVar35 >> 7)
           + uVar34;
  uVar35 = ((uVar33 >> 0x13 | uVar33 << 0x2d) ^ (uVar33 >> 0x3d | uVar33 * 8) ^ uVar33 >> 6) +
           uVar28 + ((uVar36 >> 1 | uVar36 << 0x3f) ^ (uVar36 >> 8 | uVar36 << 0x38) ^ uVar36 >> 7)
           + uVar35;
  uVar36 = ((uVar34 >> 0x13 | uVar34 << 0x2d) ^ (uVar34 >> 0x3d | uVar34 * 8) ^ uVar34 >> 6) +
           uVar29 + ((uVar37 >> 1 | uVar37 << 0x3f) ^ (uVar37 >> 8 | uVar37 << 0x38) ^ uVar37 >> 7)
           + uVar36;
  uVar37 = ((uVar35 >> 0x13 | uVar35 << 0x2d) ^ (uVar35 >> 0x3d | uVar35 * 8) ^ uVar35 >> 6) +
           uVar30 + ((uVar38 >> 1 | uVar38 << 0x3f) ^ (uVar38 >> 8 | uVar38 << 0x38) ^ uVar38 >> 7)
           + uVar37;
  uVar38 = ((uVar36 >> 0x13 | uVar36 << 0x2d) ^ (uVar36 >> 0x3d | uVar36 * 8) ^ uVar36 >> 6) +
           uVar31 + ((uVar39 >> 1 | uVar39 << 0x3f) ^ (uVar39 >> 8 | uVar39 << 0x38) ^ uVar39 >> 7)
           + uVar38;
  uVar39 = ((uVar37 >> 0x13 | uVar37 << 0x2d) ^ (uVar37 >> 0x3d | uVar37 * 8) ^ uVar37 >> 6) +
           uVar32 + ((uVar40 >> 1 | uVar40 << 0x3f) ^ (uVar40 >> 8 | uVar40 << 0x38) ^ uVar40 >> 7)
           + uVar39;
  uVar40 = ((uVar38 >> 0x13 | uVar38 << 0x2d) ^ (uVar38 >> 0x3d | uVar38 * 8) ^ uVar38 >> 6) +
           uVar33 + ((uVar41 >> 1 | uVar41 << 0x3f) ^ (uVar41 >> 8 | uVar41 << 0x38) ^ uVar41 >> 7)
           + uVar40;
  uVar41 = ((uVar39 >> 0x13 | uVar39 << 0x2d) ^ (uVar39 >> 0x3d | uVar39 * 8) ^ uVar39 >> 6) +
           uVar34 + ((uVar26 >> 1 | uVar26 << 0x3f) ^ (uVar26 >> 8 | uVar26 << 0x38) ^ uVar26 >> 7)
           + uVar41;
  lVar17 = uVar19 + ((uVar25 >> 0xe | uVar25 << 0x32) ^ (uVar25 >> 0x12 | uVar25 << 0x2e) ^
                    (uVar25 >> 0x29 | uVar25 * 0x800000)) +
           (uVar25 & uVar23 ^ (uVar25 ^ 0xffffffffffffffff) & uVar21) + 0x27b70a8546d22ffc + uVar26;
  uVar18 = uVar18 + lVar17;
  uVar19 = lVar17 + ((uVar24 >> 0x1c | uVar24 << 0x24) ^ (uVar24 >> 0x22 | uVar24 * 0x40000000) ^
                    (uVar24 >> 0x27 | uVar24 * 0x2000000)) +
                    (uVar24 & uVar22 ^ uVar24 & uVar20 ^ uVar22 & uVar20);
  lVar17 = uVar21 + ((uVar18 >> 0xe | uVar18 << 0x32) ^ (uVar18 >> 0x12 | uVar18 << 0x2e) ^
                    (uVar18 >> 0x29 | uVar18 * 0x800000)) +
           (uVar18 & uVar25 ^ (uVar18 ^ 0xffffffffffffffff) & uVar23) + 0x2e1b21385c26c926 + uVar27;
  uVar20 = uVar20 + lVar17;
  uVar21 = lVar17 + ((uVar19 >> 0x1c | uVar19 << 0x24) ^ (uVar19 >> 0x22 | uVar19 * 0x40000000) ^
                    (uVar19 >> 0x27 | uVar19 * 0x2000000)) +
                    (uVar19 & uVar24 ^ uVar19 & uVar22 ^ uVar24 & uVar22);
  lVar17 = uVar23 + ((uVar20 >> 0xe | uVar20 << 0x32) ^ (uVar20 >> 0x12 | uVar20 << 0x2e) ^
                    (uVar20 >> 0x29 | uVar20 * 0x800000)) +
           (uVar20 & uVar18 ^ (uVar20 ^ 0xffffffffffffffff) & uVar25) + 0x4d2c6dfc5ac42aed + uVar28;
  uVar22 = uVar22 + lVar17;
  uVar23 = lVar17 + ((uVar21 >> 0x1c | uVar21 << 0x24) ^ (uVar21 >> 0x22 | uVar21 * 0x40000000) ^
                    (uVar21 >> 0x27 | uVar21 * 0x2000000)) +
                    (uVar21 & uVar19 ^ uVar21 & uVar24 ^ uVar19 & uVar24);
  lVar17 = uVar25 + ((uVar22 >> 0xe | uVar22 << 0x32) ^ (uVar22 >> 0x12 | uVar22 << 0x2e) ^
                    (uVar22 >> 0x29 | uVar22 * 0x800000)) +
           (uVar22 & uVar20 ^ (uVar22 ^ 0xffffffffffffffff) & uVar18) + 0x53380d139d95b3df + uVar29;
  uVar24 = uVar24 + lVar17;
  uVar25 = lVar17 + ((uVar23 >> 0x1c | uVar23 << 0x24) ^ (uVar23 >> 0x22 | uVar23 * 0x40000000) ^
                    (uVar23 >> 0x27 | uVar23 * 0x2000000)) +
                    (uVar23 & uVar21 ^ uVar23 & uVar19 ^ uVar21 & uVar19);
  lVar17 = uVar18 + ((uVar24 >> 0xe | uVar24 << 0x32) ^ (uVar24 >> 0x12 | uVar24 << 0x2e) ^
                    (uVar24 >> 0x29 | uVar24 * 0x800000)) +
           (uVar24 & uVar22 ^ (uVar24 ^ 0xffffffffffffffff) & uVar20) + 0x650a73548baf63de + uVar30;
  uVar19 = uVar19 + lVar17;
  uVar18 = lVar17 + ((uVar25 >> 0x1c | uVar25 << 0x24) ^ (uVar25 >> 0x22 | uVar25 * 0x40000000) ^
                    (uVar25 >> 0x27 | uVar25 * 0x2000000)) +
                    (uVar25 & uVar23 ^ uVar25 & uVar21 ^ uVar23 & uVar21);
  lVar17 = uVar20 + ((uVar19 >> 0xe | uVar19 << 0x32) ^ (uVar19 >> 0x12 | uVar19 << 0x2e) ^
                    (uVar19 >> 0x29 | uVar19 * 0x800000)) +
           (uVar19 & uVar24 ^ (uVar19 ^ 0xffffffffffffffff) & uVar22) + 0x766a0abb3c77b2a8 + uVar31;
  uVar21 = uVar21 + lVar17;
  uVar20 = lVar17 + ((uVar18 >> 0x1c | uVar18 << 0x24) ^ (uVar18 >> 0x22 | uVar18 * 0x40000000) ^
                    (uVar18 >> 0x27 | uVar18 * 0x2000000)) +
                    (uVar18 & uVar25 ^ uVar18 & uVar23 ^ uVar25 & uVar23);
  lVar17 = uVar22 + ((uVar21 >> 0xe | uVar21 << 0x32) ^ (uVar21 >> 0x12 | uVar21 << 0x2e) ^
                    (uVar21 >> 0x29 | uVar21 * 0x800000)) +
           (uVar21 & uVar19 ^ (uVar21 ^ 0xffffffffffffffff) & uVar24) + -0x7e3d36d1b812511a + uVar32
  ;
  uVar23 = uVar23 + lVar17;
  uVar22 = lVar17 + ((uVar20 >> 0x1c | uVar20 << 0x24) ^ (uVar20 >> 0x22 | uVar20 * 0x40000000) ^
                    (uVar20 >> 0x27 | uVar20 * 0x2000000)) +
                    (uVar20 & uVar18 ^ uVar20 & uVar25 ^ uVar18 & uVar25);
  lVar17 = uVar24 + ((uVar23 >> 0xe | uVar23 << 0x32) ^ (uVar23 >> 0x12 | uVar23 << 0x2e) ^
                    (uVar23 >> 0x29 | uVar23 * 0x800000)) +
           (uVar23 & uVar21 ^ (uVar23 ^ 0xffffffffffffffff) & uVar19) + -0x6d8dd37aeb7dcac5 + uVar33
  ;
  uVar25 = uVar25 + lVar17;
  uVar24 = lVar17 + ((uVar22 >> 0x1c | uVar22 << 0x24) ^ (uVar22 >> 0x22 | uVar22 * 0x40000000) ^
                    (uVar22 >> 0x27 | uVar22 * 0x2000000)) +
                    (uVar22 & uVar20 ^ uVar22 & uVar18 ^ uVar20 & uVar18);
  lVar17 = uVar19 + ((uVar25 >> 0xe | uVar25 << 0x32) ^ (uVar25 >> 0x12 | uVar25 << 0x2e) ^
                    (uVar25 >> 0x29 | uVar25 * 0x800000)) +
           (uVar25 & uVar23 ^ (uVar25 ^ 0xffffffffffffffff) & uVar21) + -0x5d40175eb30efc9c + uVar34
  ;
  uVar18 = uVar18 + lVar17;
  uVar19 = lVar17 + ((uVar24 >> 0x1c | uVar24 << 0x24) ^ (uVar24 >> 0x22 | uVar24 * 0x40000000) ^
                    (uVar24 >> 0x27 | uVar24 * 0x2000000)) +
                    (uVar24 & uVar22 ^ uVar24 & uVar20 ^ uVar22 & uVar20);
  lVar17 = uVar21 + ((uVar18 >> 0xe | uVar18 << 0x32) ^ (uVar18 >> 0x12 | uVar18 << 0x2e) ^
                    (uVar18 >> 0x29 | uVar18 * 0x800000)) +
           (uVar18 & uVar25 ^ (uVar18 ^ 0xffffffffffffffff) & uVar23) + -0x57e599b443bdcfff + uVar35
  ;
  uVar20 = uVar20 + lVar17;
  uVar21 = lVar17 + ((uVar19 >> 0x1c | uVar19 << 0x24) ^ (uVar19 >> 0x22 | uVar19 * 0x40000000) ^
                    (uVar19 >> 0x27 | uVar19 * 0x2000000)) +
                    (uVar19 & uVar24 ^ uVar19 & uVar22 ^ uVar24 & uVar22);
  lVar17 = uVar23 + ((uVar20 >> 0xe | uVar20 << 0x32) ^ (uVar20 >> 0x12 | uVar20 << 0x2e) ^
                    (uVar20 >> 0x29 | uVar20 * 0x800000)) +
           (uVar20 & uVar18 ^ (uVar20 ^ 0xffffffffffffffff) & uVar25) + -0x3db4748f2f07686f + uVar36
  ;
  uVar22 = uVar22 + lVar17;
  uVar23 = lVar17 + ((uVar21 >> 0x1c | uVar21 << 0x24) ^ (uVar21 >> 0x22 | uVar21 * 0x40000000) ^
                    (uVar21 >> 0x27 | uVar21 * 0x2000000)) +
                    (uVar21 & uVar19 ^ uVar21 & uVar24 ^ uVar19 & uVar24);
  lVar17 = uVar25 + ((uVar22 >> 0xe | uVar22 << 0x32) ^ (uVar22 >> 0x12 | uVar22 << 0x2e) ^
                    (uVar22 >> 0x29 | uVar22 * 0x800000)) +
           (uVar22 & uVar20 ^ (uVar22 ^ 0xffffffffffffffff) & uVar18) + -0x3893ae5cf9ab41d0 + uVar37
  ;
  uVar24 = uVar24 + lVar17;
  uVar25 = lVar17 + ((uVar23 >> 0x1c | uVar23 << 0x24) ^ (uVar23 >> 0x22 | uVar23 * 0x40000000) ^
                    (uVar23 >> 0x27 | uVar23 * 0x2000000)) +
                    (uVar23 & uVar21 ^ uVar23 & uVar19 ^ uVar21 & uVar19);
  lVar17 = uVar18 + ((uVar24 >> 0xe | uVar24 << 0x32) ^ (uVar24 >> 0x12 | uVar24 << 0x2e) ^
                    (uVar24 >> 0x29 | uVar24 * 0x800000)) +
           (uVar24 & uVar22 ^ (uVar24 ^ 0xffffffffffffffff) & uVar20) + -0x2e6d17e62910ade8 + uVar38
  ;
  uVar19 = uVar19 + lVar17;
  uVar18 = lVar17 + ((uVar25 >> 0x1c | uVar25 << 0x24) ^ (uVar25 >> 0x22 | uVar25 * 0x40000000) ^
                    (uVar25 >> 0x27 | uVar25 * 0x2000000)) +
                    (uVar25 & uVar23 ^ uVar25 & uVar21 ^ uVar23 & uVar21);
  lVar17 = uVar20 + ((uVar19 >> 0xe | uVar19 << 0x32) ^ (uVar19 >> 0x12 | uVar19 << 0x2e) ^
                    (uVar19 >> 0x29 | uVar19 * 0x800000)) +
           (uVar19 & uVar24 ^ (uVar19 ^ 0xffffffffffffffff) & uVar22) + -0x2966f9dbaa9a56f0 + uVar39
  ;
  uVar21 = uVar21 + lVar17;
  uVar20 = lVar17 + ((uVar18 >> 0x1c | uVar18 << 0x24) ^ (uVar18 >> 0x22 | uVar18 * 0x40000000) ^
                    (uVar18 >> 0x27 | uVar18 * 0x2000000)) +
                    (uVar18 & uVar25 ^ uVar18 & uVar23 ^ uVar25 & uVar23);
  lVar17 = uVar22 + ((uVar21 >> 0xe | uVar21 << 0x32) ^ (uVar21 >> 0x12 | uVar21 << 0x2e) ^
                    (uVar21 >> 0x29 | uVar21 * 0x800000)) +
           (uVar21 & uVar19 ^ (uVar21 ^ 0xffffffffffffffff) & uVar24) + -0xbf1ca7aa88edfd6 + uVar40;
  uVar23 = uVar23 + lVar17;
  uVar22 = lVar17 + ((uVar20 >> 0x1c | uVar20 << 0x24) ^ (uVar20 >> 0x22 | uVar20 * 0x40000000) ^
                    (uVar20 >> 0x27 | uVar20 * 0x2000000)) +
                    (uVar20 & uVar18 ^ uVar20 & uVar25 ^ uVar18 & uVar25);
  lVar17 = uVar24 + ((uVar23 >> 0xe | uVar23 << 0x32) ^ (uVar23 >> 0x12 | uVar23 << 0x2e) ^
                    (uVar23 >> 0x29 | uVar23 * 0x800000)) +
           (uVar23 & uVar21 ^ (uVar23 ^ 0xffffffffffffffff) & uVar19) + 0x106aa07032bbd1b8 + uVar41;
  uVar25 = uVar25 + lVar17;
  uVar24 = lVar17 + ((uVar22 >> 0x1c | uVar22 << 0x24) ^ (uVar22 >> 0x22 | uVar22 * 0x40000000) ^
                    (uVar22 >> 0x27 | uVar22 * 0x2000000)) +
                    (uVar22 & uVar20 ^ uVar22 & uVar18 ^ uVar20 & uVar18);
  uVar26 = ((uVar40 >> 0x13 | uVar40 << 0x2d) ^ (uVar40 >> 0x3d | uVar40 * 8) ^ uVar40 >> 6) +
           uVar35 + ((uVar27 >> 1 | uVar27 << 0x3f) ^ (uVar27 >> 8 | uVar27 << 0x38) ^ uVar27 >> 7)
           + uVar26;
  uVar27 = ((uVar41 >> 0x13 | uVar41 << 0x2d) ^ (uVar41 >> 0x3d | uVar41 * 8) ^ uVar41 >> 6) +
           uVar36 + ((uVar28 >> 1 | uVar28 << 0x3f) ^ (uVar28 >> 8 | uVar28 << 0x38) ^ uVar28 >> 7)
           + uVar27;
  uVar28 = ((uVar26 >> 0x13 | uVar26 << 0x2d) ^ (uVar26 >> 0x3d | uVar26 * 8) ^ uVar26 >> 6) +
           uVar37 + ((uVar29 >> 1 | uVar29 << 0x3f) ^ (uVar29 >> 8 | uVar29 << 0x38) ^ uVar29 >> 7)
           + uVar28;
  uVar29 = ((uVar27 >> 0x13 | uVar27 << 0x2d) ^ (uVar27 >> 0x3d | uVar27 * 8) ^ uVar27 >> 6) +
           uVar38 + ((uVar30 >> 1 | uVar30 << 0x3f) ^ (uVar30 >> 8 | uVar30 << 0x38) ^ uVar30 >> 7)
           + uVar29;
  uVar30 = ((uVar28 >> 0x13 | uVar28 << 0x2d) ^ (uVar28 >> 0x3d | uVar28 * 8) ^ uVar28 >> 6) +
           uVar39 + ((uVar31 >> 1 | uVar31 << 0x3f) ^ (uVar31 >> 8 | uVar31 << 0x38) ^ uVar31 >> 7)
           + uVar30;
  uVar31 = ((uVar29 >> 0x13 | uVar29 << 0x2d) ^ (uVar29 >> 0x3d | uVar29 * 8) ^ uVar29 >> 6) +
           uVar40 + ((uVar32 >> 1 | uVar32 << 0x3f) ^ (uVar32 >> 8 | uVar32 << 0x38) ^ uVar32 >> 7)
           + uVar31;
  uVar32 = ((uVar30 >> 0x13 | uVar30 << 0x2d) ^ (uVar30 >> 0x3d | uVar30 * 8) ^ uVar30 >> 6) +
           uVar41 + ((uVar33 >> 1 | uVar33 << 0x3f) ^ (uVar33 >> 8 | uVar33 << 0x38) ^ uVar33 >> 7)
           + uVar32;
  uVar33 = ((uVar31 >> 0x13 | uVar31 << 0x2d) ^ (uVar31 >> 0x3d | uVar31 * 8) ^ uVar31 >> 6) +
           uVar26 + ((uVar34 >> 1 | uVar34 << 0x3f) ^ (uVar34 >> 8 | uVar34 << 0x38) ^ uVar34 >> 7)
           + uVar33;
  uVar34 = ((uVar32 >> 0x13 | uVar32 << 0x2d) ^ (uVar32 >> 0x3d | uVar32 * 8) ^ uVar32 >> 6) +
           uVar27 + ((uVar35 >> 1 | uVar35 << 0x3f) ^ (uVar35 >> 8 | uVar35 << 0x38) ^ uVar35 >> 7)
           + uVar34;
  uVar35 = ((uVar33 >> 0x13 | uVar33 << 0x2d) ^ (uVar33 >> 0x3d | uVar33 * 8) ^ uVar33 >> 6) +
           uVar28 + ((uVar36 >> 1 | uVar36 << 0x3f) ^ (uVar36 >> 8 | uVar36 << 0x38) ^ uVar36 >> 7)
           + uVar35;
  uVar36 = ((uVar34 >> 0x13 | uVar34 << 0x2d) ^ (uVar34 >> 0x3d | uVar34 * 8) ^ uVar34 >> 6) +
           uVar29 + ((uVar37 >> 1 | uVar37 << 0x3f) ^ (uVar37 >> 8 | uVar37 << 0x38) ^ uVar37 >> 7)
           + uVar36;
  uVar37 = ((uVar35 >> 0x13 | uVar35 << 0x2d) ^ (uVar35 >> 0x3d | uVar35 * 8) ^ uVar35 >> 6) +
           uVar30 + ((uVar38 >> 1 | uVar38 << 0x3f) ^ (uVar38 >> 8 | uVar38 << 0x38) ^ uVar38 >> 7)
           + uVar37;
  uVar38 = ((uVar36 >> 0x13 | uVar36 << 0x2d) ^ (uVar36 >> 0x3d | uVar36 * 8) ^ uVar36 >> 6) +
           uVar31 + ((uVar39 >> 1 | uVar39 << 0x3f) ^ (uVar39 >> 8 | uVar39 << 0x38) ^ uVar39 >> 7)
           + uVar38;
  uVar39 = ((uVar37 >> 0x13 | uVar37 << 0x2d) ^ (uVar37 >> 0x3d | uVar37 * 8) ^ uVar37 >> 6) +
           uVar32 + ((uVar40 >> 1 | uVar40 << 0x3f) ^ (uVar40 >> 8 | uVar40 << 0x38) ^ uVar40 >> 7)
           + uVar39;
  uVar40 = ((uVar38 >> 0x13 | uVar38 << 0x2d) ^ (uVar38 >> 0x3d | uVar38 * 8) ^ uVar38 >> 6) +
           uVar33 + ((uVar41 >> 1 | uVar41 << 0x3f) ^ (uVar41 >> 8 | uVar41 << 0x38) ^ uVar41 >> 7)
           + uVar40;
  uVar41 = ((uVar39 >> 0x13 | uVar39 << 0x2d) ^ (uVar39 >> 0x3d | uVar39 * 8) ^ uVar39 >> 6) +
           uVar34 + ((uVar26 >> 1 | uVar26 << 0x3f) ^ (uVar26 >> 8 | uVar26 << 0x38) ^ uVar26 >> 7)
           + uVar41;
  lVar17 = uVar19 + ((uVar25 >> 0xe | uVar25 << 0x32) ^ (uVar25 >> 0x12 | uVar25 << 0x2e) ^
                    (uVar25 >> 0x29 | uVar25 * 0x800000)) +
           (uVar25 & uVar23 ^ (uVar25 ^ 0xffffffffffffffff) & uVar21) + 0x19a4c116b8d2d0c8 + uVar26;
  uVar18 = uVar18 + lVar17;
  uVar19 = lVar17 + ((uVar24 >> 0x1c | uVar24 << 0x24) ^ (uVar24 >> 0x22 | uVar24 * 0x40000000) ^
                    (uVar24 >> 0x27 | uVar24 * 0x2000000)) +
                    (uVar24 & uVar22 ^ uVar24 & uVar20 ^ uVar22 & uVar20);
  lVar17 = uVar21 + ((uVar18 >> 0xe | uVar18 << 0x32) ^ (uVar18 >> 0x12 | uVar18 << 0x2e) ^
                    (uVar18 >> 0x29 | uVar18 * 0x800000)) +
           (uVar18 & uVar25 ^ (uVar18 ^ 0xffffffffffffffff) & uVar23) + 0x1e376c085141ab53 + uVar27;
  uVar20 = uVar20 + lVar17;
  uVar21 = lVar17 + ((uVar19 >> 0x1c | uVar19 << 0x24) ^ (uVar19 >> 0x22 | uVar19 * 0x40000000) ^
                    (uVar19 >> 0x27 | uVar19 * 0x2000000)) +
                    (uVar19 & uVar24 ^ uVar19 & uVar22 ^ uVar24 & uVar22);
  lVar17 = uVar23 + ((uVar20 >> 0xe | uVar20 << 0x32) ^ (uVar20 >> 0x12 | uVar20 << 0x2e) ^
                    (uVar20 >> 0x29 | uVar20 * 0x800000)) +
           (uVar20 & uVar18 ^ (uVar20 ^ 0xffffffffffffffff) & uVar25) + 0x2748774cdf8eeb99 + uVar28;
  uVar22 = uVar22 + lVar17;
  uVar23 = lVar17 + ((uVar21 >> 0x1c | uVar21 << 0x24) ^ (uVar21 >> 0x22 | uVar21 * 0x40000000) ^
                    (uVar21 >> 0x27 | uVar21 * 0x2000000)) +
                    (uVar21 & uVar19 ^ uVar21 & uVar24 ^ uVar19 & uVar24);
  lVar17 = uVar25 + ((uVar22 >> 0xe | uVar22 << 0x32) ^ (uVar22 >> 0x12 | uVar22 << 0x2e) ^
                    (uVar22 >> 0x29 | uVar22 * 0x800000)) +
           (uVar22 & uVar20 ^ (uVar22 ^ 0xffffffffffffffff) & uVar18) + 0x34b0bcb5e19b48a8 + uVar29;
  uVar24 = uVar24 + lVar17;
  uVar25 = lVar17 + ((uVar23 >> 0x1c | uVar23 << 0x24) ^ (uVar23 >> 0x22 | uVar23 * 0x40000000) ^
                    (uVar23 >> 0x27 | uVar23 * 0x2000000)) +
                    (uVar23 & uVar21 ^ uVar23 & uVar19 ^ uVar21 & uVar19);
  lVar17 = uVar18 + ((uVar24 >> 0xe | uVar24 << 0x32) ^ (uVar24 >> 0x12 | uVar24 << 0x2e) ^
                    (uVar24 >> 0x29 | uVar24 * 0x800000)) +
           (uVar24 & uVar22 ^ (uVar24 ^ 0xffffffffffffffff) & uVar20) + 0x391c0cb3c5c95a63 + uVar30;
  uVar19 = uVar19 + lVar17;
  uVar18 = lVar17 + ((uVar25 >> 0x1c | uVar25 << 0x24) ^ (uVar25 >> 0x22 | uVar25 * 0x40000000) ^
                    (uVar25 >> 0x27 | uVar25 * 0x2000000)) +
                    (uVar25 & uVar23 ^ uVar25 & uVar21 ^ uVar23 & uVar21);
  lVar17 = uVar20 + ((uVar19 >> 0xe | uVar19 << 0x32) ^ (uVar19 >> 0x12 | uVar19 << 0x2e) ^
                    (uVar19 >> 0x29 | uVar19 * 0x800000)) +
           (uVar19 & uVar24 ^ (uVar19 ^ 0xffffffffffffffff) & uVar22) + 0x4ed8aa4ae3418acb + uVar31;
  uVar21 = uVar21 + lVar17;
  uVar20 = lVar17 + ((uVar18 >> 0x1c | uVar18 << 0x24) ^ (uVar18 >> 0x22 | uVar18 * 0x40000000) ^
                    (uVar18 >> 0x27 | uVar18 * 0x2000000)) +
                    (uVar18 & uVar25 ^ uVar18 & uVar23 ^ uVar25 & uVar23);
  lVar17 = uVar22 + ((uVar21 >> 0xe | uVar21 << 0x32) ^ (uVar21 >> 0x12 | uVar21 << 0x2e) ^
                    (uVar21 >> 0x29 | uVar21 * 0x800000)) +
           (uVar21 & uVar19 ^ (uVar21 ^ 0xffffffffffffffff) & uVar24) + 0x5b9cca4f7763e373 + uVar32;
  uVar23 = uVar23 + lVar17;
  uVar22 = lVar17 + ((uVar20 >> 0x1c | uVar20 << 0x24) ^ (uVar20 >> 0x22 | uVar20 * 0x40000000) ^
                    (uVar20 >> 0x27 | uVar20 * 0x2000000)) +
                    (uVar20 & uVar18 ^ uVar20 & uVar25 ^ uVar18 & uVar25);
  lVar17 = uVar24 + ((uVar23 >> 0xe | uVar23 << 0x32) ^ (uVar23 >> 0x12 | uVar23 << 0x2e) ^
                    (uVar23 >> 0x29 | uVar23 * 0x800000)) +
           (uVar23 & uVar21 ^ (uVar23 ^ 0xffffffffffffffff) & uVar19) + 0x682e6ff3d6b2b8a3 + uVar33;
  uVar25 = uVar25 + lVar17;
  uVar24 = lVar17 + ((uVar22 >> 0x1c | uVar22 << 0x24) ^ (uVar22 >> 0x22 | uVar22 * 0x40000000) ^
                    (uVar22 >> 0x27 | uVar22 * 0x2000000)) +
                    (uVar22 & uVar20 ^ uVar22 & uVar18 ^ uVar20 & uVar18);
  lVar17 = uVar19 + ((uVar25 >> 0xe | uVar25 << 0x32) ^ (uVar25 >> 0x12 | uVar25 << 0x2e) ^
                    (uVar25 >> 0x29 | uVar25 * 0x800000)) +
           (uVar25 & uVar23 ^ (uVar25 ^ 0xffffffffffffffff) & uVar21) + 0x748f82ee5defb2fc + uVar34;
  uVar18 = uVar18 + lVar17;
  uVar19 = lVar17 + ((uVar24 >> 0x1c | uVar24 << 0x24) ^ (uVar24 >> 0x22 | uVar24 * 0x40000000) ^
                    (uVar24 >> 0x27 | uVar24 * 0x2000000)) +
                    (uVar24 & uVar22 ^ uVar24 & uVar20 ^ uVar22 & uVar20);
  lVar17 = uVar21 + ((uVar18 >> 0xe | uVar18 << 0x32) ^ (uVar18 >> 0x12 | uVar18 << 0x2e) ^
                    (uVar18 >> 0x29 | uVar18 * 0x800000)) +
           (uVar18 & uVar25 ^ (uVar18 ^ 0xffffffffffffffff) & uVar23) + 0x78a5636f43172f60 + uVar35;
  uVar20 = uVar20 + lVar17;
  uVar21 = lVar17 + ((uVar19 >> 0x1c | uVar19 << 0x24) ^ (uVar19 >> 0x22 | uVar19 * 0x40000000) ^
                    (uVar19 >> 0x27 | uVar19 * 0x2000000)) +
                    (uVar19 & uVar24 ^ uVar19 & uVar22 ^ uVar24 & uVar22);
  lVar17 = uVar23 + ((uVar20 >> 0xe | uVar20 << 0x32) ^ (uVar20 >> 0x12 | uVar20 << 0x2e) ^
                    (uVar20 >> 0x29 | uVar20 * 0x800000)) +
           (uVar20 & uVar18 ^ (uVar20 ^ 0xffffffffffffffff) & uVar25) + -0x7b3787eb5e0f548e + uVar36
  ;
  uVar22 = uVar22 + lVar17;
  uVar23 = lVar17 + ((uVar21 >> 0x1c | uVar21 << 0x24) ^ (uVar21 >> 0x22 | uVar21 * 0x40000000) ^
                    (uVar21 >> 0x27 | uVar21 * 0x2000000)) +
                    (uVar21 & uVar19 ^ uVar21 & uVar24 ^ uVar19 & uVar24);
  lVar17 = uVar25 + ((uVar22 >> 0xe | uVar22 << 0x32) ^ (uVar22 >> 0x12 | uVar22 << 0x2e) ^
                    (uVar22 >> 0x29 | uVar22 * 0x800000)) +
           (uVar22 & uVar20 ^ (uVar22 ^ 0xffffffffffffffff) & uVar18) + -0x7338fdf7e59bc614 + uVar37
  ;
  uVar24 = uVar24 + lVar17;
  uVar25 = lVar17 + ((uVar23 >> 0x1c | uVar23 << 0x24) ^ (uVar23 >> 0x22 | uVar23 * 0x40000000) ^
                    (uVar23 >> 0x27 | uVar23 * 0x2000000)) +
                    (uVar23 & uVar21 ^ uVar23 & uVar19 ^ uVar21 & uVar19);
  lVar17 = uVar18 + ((uVar24 >> 0xe | uVar24 << 0x32) ^ (uVar24 >> 0x12 | uVar24 << 0x2e) ^
                    (uVar24 >> 0x29 | uVar24 * 0x800000)) +
           (uVar24 & uVar22 ^ (uVar24 ^ 0xffffffffffffffff) & uVar20) + -0x6f410005dc9ce1d8 + uVar38
  ;
  uVar19 = uVar19 + lVar17;
  uVar18 = lVar17 + ((uVar25 >> 0x1c | uVar25 << 0x24) ^ (uVar25 >> 0x22 | uVar25 * 0x40000000) ^
                    (uVar25 >> 0x27 | uVar25 * 0x2000000)) +
                    (uVar25 & uVar23 ^ uVar25 & uVar21 ^ uVar23 & uVar21);
  lVar17 = uVar20 + ((uVar19 >> 0xe | uVar19 << 0x32) ^ (uVar19 >> 0x12 | uVar19 << 0x2e) ^
                    (uVar19 >> 0x29 | uVar19 * 0x800000)) +
           (uVar19 & uVar24 ^ (uVar19 ^ 0xffffffffffffffff) & uVar22) + -0x5baf9314217d4217 + uVar39
  ;
  uVar21 = uVar21 + lVar17;
  uVar20 = lVar17 + ((uVar18 >> 0x1c | uVar18 << 0x24) ^ (uVar18 >> 0x22 | uVar18 * 0x40000000) ^
                    (uVar18 >> 0x27 | uVar18 * 0x2000000)) +
                    (uVar18 & uVar25 ^ uVar18 & uVar23 ^ uVar25 & uVar23);
  lVar17 = uVar22 + ((uVar21 >> 0xe | uVar21 << 0x32) ^ (uVar21 >> 0x12 | uVar21 << 0x2e) ^
                    (uVar21 >> 0x29 | uVar21 * 0x800000)) +
           (uVar21 & uVar19 ^ (uVar21 ^ 0xffffffffffffffff) & uVar24) + -0x41065c084d3986eb + uVar40
  ;
  uVar23 = uVar23 + lVar17;
  uVar22 = lVar17 + ((uVar20 >> 0x1c | uVar20 << 0x24) ^ (uVar20 >> 0x22 | uVar20 * 0x40000000) ^
                    (uVar20 >> 0x27 | uVar20 * 0x2000000)) +
                    (uVar20 & uVar18 ^ uVar20 & uVar25 ^ uVar18 & uVar25);
  lVar17 = uVar24 + ((uVar23 >> 0xe | uVar23 << 0x32) ^ (uVar23 >> 0x12 | uVar23 << 0x2e) ^
                    (uVar23 >> 0x29 | uVar23 * 0x800000)) +
           (uVar23 & uVar21 ^ (uVar23 ^ 0xffffffffffffffff) & uVar19) + -0x398e870d1c8dacd5 + uVar41
  ;
  uVar25 = uVar25 + lVar17;
  uVar24 = lVar17 + ((uVar22 >> 0x1c | uVar22 << 0x24) ^ (uVar22 >> 0x22 | uVar22 * 0x40000000) ^
                    (uVar22 >> 0x27 | uVar22 * 0x2000000)) +
                    (uVar22 & uVar20 ^ uVar22 & uVar18 ^ uVar20 & uVar18);
  uVar26 = ((uVar40 >> 0x13 | uVar40 << 0x2d) ^ (uVar40 >> 0x3d | uVar40 * 8) ^ uVar40 >> 6) +
           uVar35 + ((uVar27 >> 1 | uVar27 << 0x3f) ^ (uVar27 >> 8 | uVar27 << 0x38) ^ uVar27 >> 7)
           + uVar26;
  uVar27 = ((uVar41 >> 0x13 | uVar41 << 0x2d) ^ (uVar41 >> 0x3d | uVar41 * 8) ^ uVar41 >> 6) +
           uVar36 + ((uVar28 >> 1 | uVar28 << 0x3f) ^ (uVar28 >> 8 | uVar28 << 0x38) ^ uVar28 >> 7)
           + uVar27;
  uVar28 = ((uVar26 >> 0x13 | uVar26 << 0x2d) ^ (uVar26 >> 0x3d | uVar26 * 8) ^ uVar26 >> 6) +
           uVar37 + ((uVar29 >> 1 | uVar29 << 0x3f) ^ (uVar29 >> 8 | uVar29 << 0x38) ^ uVar29 >> 7)
           + uVar28;
  uVar29 = ((uVar27 >> 0x13 | uVar27 << 0x2d) ^ (uVar27 >> 0x3d | uVar27 * 8) ^ uVar27 >> 6) +
           uVar38 + ((uVar30 >> 1 | uVar30 << 0x3f) ^ (uVar30 >> 8 | uVar30 << 0x38) ^ uVar30 >> 7)
           + uVar29;
  uVar30 = ((uVar28 >> 0x13 | uVar28 << 0x2d) ^ (uVar28 >> 0x3d | uVar28 * 8) ^ uVar28 >> 6) +
           uVar39 + ((uVar31 >> 1 | uVar31 << 0x3f) ^ (uVar31 >> 8 | uVar31 << 0x38) ^ uVar31 >> 7)
           + uVar30;
  uVar31 = ((uVar29 >> 0x13 | uVar29 << 0x2d) ^ (uVar29 >> 0x3d | uVar29 * 8) ^ uVar29 >> 6) +
           uVar40 + ((uVar32 >> 1 | uVar32 << 0x3f) ^ (uVar32 >> 8 | uVar32 << 0x38) ^ uVar32 >> 7)
           + uVar31;
  uVar32 = ((uVar30 >> 0x13 | uVar30 << 0x2d) ^ (uVar30 >> 0x3d | uVar30 * 8) ^ uVar30 >> 6) +
           uVar41 + ((uVar33 >> 1 | uVar33 << 0x3f) ^ (uVar33 >> 8 | uVar33 << 0x38) ^ uVar33 >> 7)
           + uVar32;
  uVar33 = ((uVar31 >> 0x13 | uVar31 << 0x2d) ^ (uVar31 >> 0x3d | uVar31 * 8) ^ uVar31 >> 6) +
           uVar26 + ((uVar34 >> 1 | uVar34 << 0x3f) ^ (uVar34 >> 8 | uVar34 << 0x38) ^ uVar34 >> 7)
           + uVar33;
  uVar34 = ((uVar32 >> 0x13 | uVar32 << 0x2d) ^ (uVar32 >> 0x3d | uVar32 * 8) ^ uVar32 >> 6) +
           uVar27 + ((uVar35 >> 1 | uVar35 << 0x3f) ^ (uVar35 >> 8 | uVar35 << 0x38) ^ uVar35 >> 7)
           + uVar34;
  uVar35 = ((uVar33 >> 0x13 | uVar33 << 0x2d) ^ (uVar33 >> 0x3d | uVar33 * 8) ^ uVar33 >> 6) +
           uVar28 + ((uVar36 >> 1 | uVar36 << 0x3f) ^ (uVar36 >> 8 | uVar36 << 0x38) ^ uVar36 >> 7)
           + uVar35;
  uVar36 = ((uVar34 >> 0x13 | uVar34 << 0x2d) ^ (uVar34 >> 0x3d | uVar34 * 8) ^ uVar34 >> 6) +
           uVar29 + ((uVar37 >> 1 | uVar37 << 0x3f) ^ (uVar37 >> 8 | uVar37 << 0x38) ^ uVar37 >> 7)
           + uVar36;
  uVar37 = ((uVar35 >> 0x13 | uVar35 << 0x2d) ^ (uVar35 >> 0x3d | uVar35 * 8) ^ uVar35 >> 6) +
           uVar30 + ((uVar38 >> 1 | uVar38 << 0x3f) ^ (uVar38 >> 8 | uVar38 << 0x38) ^ uVar38 >> 7)
           + uVar37;
  uVar38 = ((uVar36 >> 0x13 | uVar36 << 0x2d) ^ (uVar36 >> 0x3d | uVar36 * 8) ^ uVar36 >> 6) +
           uVar31 + ((uVar39 >> 1 | uVar39 << 0x3f) ^ (uVar39 >> 8 | uVar39 << 0x38) ^ uVar39 >> 7)
           + uVar38;
  uVar39 = ((uVar37 >> 0x13 | uVar37 << 0x2d) ^ (uVar37 >> 0x3d | uVar37 * 8) ^ uVar37 >> 6) +
           uVar32 + ((uVar40 >> 1 | uVar40 << 0x3f) ^ (uVar40 >> 8 | uVar40 << 0x38) ^ uVar40 >> 7)
           + uVar39;
  lVar17 = uVar19 + ((uVar25 >> 0xe | uVar25 << 0x32) ^ (uVar25 >> 0x12 | uVar25 << 0x2e) ^
                    (uVar25 >> 0x29 | uVar25 * 0x800000)) +
           (uVar25 & uVar23 ^ (uVar25 ^ 0xffffffffffffffff) & uVar21) + -0x35d8c13115d99e64 + uVar26
  ;
  uVar18 = uVar18 + lVar17;
  uVar19 = lVar17 + ((uVar24 >> 0x1c | uVar24 << 0x24) ^ (uVar24 >> 0x22 | uVar24 * 0x40000000) ^
                    (uVar24 >> 0x27 | uVar24 * 0x2000000)) +
                    (uVar24 & uVar22 ^ uVar24 & uVar20 ^ uVar22 & uVar20);
  lVar17 = uVar21 + ((uVar18 >> 0xe | uVar18 << 0x32) ^ (uVar18 >> 0x12 | uVar18 << 0x2e) ^
                    (uVar18 >> 0x29 | uVar18 * 0x800000)) +
           (uVar18 & uVar25 ^ (uVar18 ^ 0xffffffffffffffff) & uVar23) + -0x2e794738de3f3df9 + uVar27
  ;
  uVar20 = uVar20 + lVar17;
  uVar21 = lVar17 + ((uVar19 >> 0x1c | uVar19 << 0x24) ^ (uVar19 >> 0x22 | uVar19 * 0x40000000) ^
                    (uVar19 >> 0x27 | uVar19 * 0x2000000)) +
                    (uVar19 & uVar24 ^ uVar19 & uVar22 ^ uVar24 & uVar22);
  lVar17 = uVar23 + ((uVar20 >> 0xe | uVar20 << 0x32) ^ (uVar20 >> 0x12 | uVar20 << 0x2e) ^
                    (uVar20 >> 0x29 | uVar20 * 0x800000)) +
           (uVar20 & uVar18 ^ (uVar20 ^ 0xffffffffffffffff) & uVar25) + -0x15258229321f14e2 + uVar28
  ;
  uVar22 = uVar22 + lVar17;
  uVar23 = lVar17 + ((uVar21 >> 0x1c | uVar21 << 0x24) ^ (uVar21 >> 0x22 | uVar21 * 0x40000000) ^
                    (uVar21 >> 0x27 | uVar21 * 0x2000000)) +
                    (uVar21 & uVar19 ^ uVar21 & uVar24 ^ uVar19 & uVar24);
  lVar17 = uVar25 + ((uVar22 >> 0xe | uVar22 << 0x32) ^ (uVar22 >> 0x12 | uVar22 << 0x2e) ^
                    (uVar22 >> 0x29 | uVar22 * 0x800000)) +
           (uVar22 & uVar20 ^ (uVar22 ^ 0xffffffffffffffff) & uVar18) + -0xa82b08011912e88 + uVar29;
  uVar24 = uVar24 + lVar17;
  uVar25 = lVar17 + ((uVar23 >> 0x1c | uVar23 << 0x24) ^ (uVar23 >> 0x22 | uVar23 * 0x40000000) ^
                    (uVar23 >> 0x27 | uVar23 * 0x2000000)) +
                    (uVar23 & uVar21 ^ uVar23 & uVar19 ^ uVar21 & uVar19);
  lVar17 = uVar18 + ((uVar24 >> 0xe | uVar24 << 0x32) ^ (uVar24 >> 0x12 | uVar24 << 0x2e) ^
                    (uVar24 >> 0x29 | uVar24 * 0x800000)) +
           (uVar24 & uVar22 ^ (uVar24 ^ 0xffffffffffffffff) & uVar20) + 0x6f067aa72176fba + uVar30;
  uVar19 = uVar19 + lVar17;
  uVar18 = lVar17 + ((uVar25 >> 0x1c | uVar25 << 0x24) ^ (uVar25 >> 0x22 | uVar25 * 0x40000000) ^
                    (uVar25 >> 0x27 | uVar25 * 0x2000000)) +
                    (uVar25 & uVar23 ^ uVar25 & uVar21 ^ uVar23 & uVar21);
  lVar17 = uVar20 + ((uVar19 >> 0xe | uVar19 << 0x32) ^ (uVar19 >> 0x12 | uVar19 << 0x2e) ^
                    (uVar19 >> 0x29 | uVar19 * 0x800000)) +
           (uVar19 & uVar24 ^ (uVar19 ^ 0xffffffffffffffff) & uVar22) + 0xa637dc5a2c898a6 + uVar31;
  uVar21 = uVar21 + lVar17;
  uVar20 = lVar17 + ((uVar18 >> 0x1c | uVar18 << 0x24) ^ (uVar18 >> 0x22 | uVar18 * 0x40000000) ^
                    (uVar18 >> 0x27 | uVar18 * 0x2000000)) +
                    (uVar18 & uVar25 ^ uVar18 & uVar23 ^ uVar25 & uVar23);
  lVar17 = uVar22 + ((uVar21 >> 0xe | uVar21 << 0x32) ^ (uVar21 >> 0x12 | uVar21 << 0x2e) ^
                    (uVar21 >> 0x29 | uVar21 * 0x800000)) +
           (uVar21 & uVar19 ^ (uVar21 ^ 0xffffffffffffffff) & uVar24) + 0x113f9804bef90dae + uVar32;
  uVar23 = uVar23 + lVar17;
  uVar22 = lVar17 + ((uVar20 >> 0x1c | uVar20 << 0x24) ^ (uVar20 >> 0x22 | uVar20 * 0x40000000) ^
                    (uVar20 >> 0x27 | uVar20 * 0x2000000)) +
                    (uVar20 & uVar18 ^ uVar20 & uVar25 ^ uVar18 & uVar25);
  lVar17 = uVar24 + ((uVar23 >> 0xe | uVar23 << 0x32) ^ (uVar23 >> 0x12 | uVar23 << 0x2e) ^
                    (uVar23 >> 0x29 | uVar23 * 0x800000)) +
           (uVar23 & uVar21 ^ (uVar23 ^ 0xffffffffffffffff) & uVar19) + 0x1b710b35131c471b + uVar33;
  uVar25 = uVar25 + lVar17;
  uVar24 = lVar17 + ((uVar22 >> 0x1c | uVar22 << 0x24) ^ (uVar22 >> 0x22 | uVar22 * 0x40000000) ^
                    (uVar22 >> 0x27 | uVar22 * 0x2000000)) +
                    (uVar22 & uVar20 ^ uVar22 & uVar18 ^ uVar20 & uVar18);
  lVar17 = uVar19 + ((uVar25 >> 0xe | uVar25 << 0x32) ^ (uVar25 >> 0x12 | uVar25 << 0x2e) ^
                    (uVar25 >> 0x29 | uVar25 * 0x800000)) +
           (uVar25 & uVar23 ^ (uVar25 ^ 0xffffffffffffffff) & uVar21) + 0x28db77f523047d84 + uVar34;
  uVar18 = uVar18 + lVar17;
  uVar19 = lVar17 + ((uVar24 >> 0x1c | uVar24 << 0x24) ^ (uVar24 >> 0x22 | uVar24 * 0x40000000) ^
                    (uVar24 >> 0x27 | uVar24 * 0x2000000)) +
                    (uVar24 & uVar22 ^ uVar24 & uVar20 ^ uVar22 & uVar20);
  lVar17 = uVar21 + ((uVar18 >> 0xe | uVar18 << 0x32) ^ (uVar18 >> 0x12 | uVar18 << 0x2e) ^
                    (uVar18 >> 0x29 | uVar18 * 0x800000)) +
           (uVar18 & uVar25 ^ (uVar18 ^ 0xffffffffffffffff) & uVar23) + 0x32caab7b40c72493 + uVar35;
  uVar20 = uVar20 + lVar17;
  uVar21 = lVar17 + ((uVar19 >> 0x1c | uVar19 << 0x24) ^ (uVar19 >> 0x22 | uVar19 * 0x40000000) ^
                    (uVar19 >> 0x27 | uVar19 * 0x2000000)) +
                    (uVar19 & uVar24 ^ uVar19 & uVar22 ^ uVar24 & uVar22);
  lVar17 = uVar23 + ((uVar20 >> 0xe | uVar20 << 0x32) ^ (uVar20 >> 0x12 | uVar20 << 0x2e) ^
                    (uVar20 >> 0x29 | uVar20 * 0x800000)) +
           (uVar20 & uVar18 ^ (uVar20 ^ 0xffffffffffffffff) & uVar25) + 0x3c9ebe0a15c9bebc + uVar36;
  uVar22 = uVar22 + lVar17;
  uVar23 = lVar17 + ((uVar21 >> 0x1c | uVar21 << 0x24) ^ (uVar21 >> 0x22 | uVar21 * 0x40000000) ^
                    (uVar21 >> 0x27 | uVar21 * 0x2000000)) +
                    (uVar21 & uVar19 ^ uVar21 & uVar24 ^ uVar19 & uVar24);
  lVar17 = uVar25 + ((uVar22 >> 0xe | uVar22 << 0x32) ^ (uVar22 >> 0x12 | uVar22 << 0x2e) ^
                    (uVar22 >> 0x29 | uVar22 * 0x800000)) +
           (uVar22 & uVar20 ^ (uVar22 ^ 0xffffffffffffffff) & uVar18) + 0x431d67c49c100d4c + uVar37;
  uVar24 = uVar24 + lVar17;
  uVar25 = lVar17 + ((uVar23 >> 0x1c | uVar23 << 0x24) ^ (uVar23 >> 0x22 | uVar23 * 0x40000000) ^
                    (uVar23 >> 0x27 | uVar23 * 0x2000000)) +
                    (uVar23 & uVar21 ^ uVar23 & uVar19 ^ uVar21 & uVar19);
  lVar17 = uVar18 + ((uVar24 >> 0xe | uVar24 << 0x32) ^ (uVar24 >> 0x12 | uVar24 << 0x2e) ^
                    (uVar24 >> 0x29 | uVar24 * 0x800000)) +
           (uVar24 & uVar22 ^ (uVar24 ^ 0xffffffffffffffff) & uVar20) + 0x4cc5d4becb3e42b6 + uVar38;
  uVar19 = uVar19 + lVar17;
  uVar18 = lVar17 + ((uVar25 >> 0x1c | uVar25 << 0x24) ^ (uVar25 >> 0x22 | uVar25 * 0x40000000) ^
                    (uVar25 >> 0x27 | uVar25 * 0x2000000)) +
                    (uVar25 & uVar23 ^ uVar25 & uVar21 ^ uVar23 & uVar21);
  lVar17 = uVar20 + ((uVar19 >> 0xe | uVar19 << 0x32) ^ (uVar19 >> 0x12 | uVar19 << 0x2e) ^
                    (uVar19 >> 0x29 | uVar19 * 0x800000)) +
           (uVar19 & uVar24 ^ (uVar19 ^ 0xffffffffffffffff) & uVar22) + 0x597f299cfc657e2a + uVar39;
  uVar21 = uVar21 + lVar17;
  uVar20 = lVar17 + ((uVar18 >> 0x1c | uVar18 << 0x24) ^ (uVar18 >> 0x22 | uVar18 * 0x40000000) ^
                    (uVar18 >> 0x27 | uVar18 * 0x2000000)) +
                    (uVar18 & uVar25 ^ uVar18 & uVar23 ^ uVar25 & uVar23);
  lVar17 = uVar22 + ((uVar21 >> 0xe | uVar21 << 0x32) ^ (uVar21 >> 0x12 | uVar21 << 0x2e) ^
                    (uVar21 >> 0x29 | uVar21 * 0x800000)) +
           (uVar21 & uVar19 ^ (uVar21 ^ 0xffffffffffffffff) & uVar24) + 0x5fcb6fab3ad6faec +
           ((uVar38 >> 0x13 | uVar38 << 0x2d) ^ (uVar38 >> 0x3d | uVar38 * 8) ^ uVar38 >> 6) +
           uVar33 + ((uVar41 >> 1 | uVar41 << 0x3f) ^ (uVar41 >> 8 | uVar41 << 0x38) ^ uVar41 >> 7)
           + uVar40;
  uVar23 = uVar23 + lVar17;
  uVar22 = lVar17 + ((uVar20 >> 0x1c | uVar20 << 0x24) ^ (uVar20 >> 0x22 | uVar20 * 0x40000000) ^
                    (uVar20 >> 0x27 | uVar20 * 0x2000000)) +
                    (uVar20 & uVar18 ^ uVar20 & uVar25 ^ uVar18 & uVar25);
  lVar17 = uVar24 + ((uVar23 >> 0xe | uVar23 << 0x32) ^ (uVar23 >> 0x12 | uVar23 << 0x2e) ^
                    (uVar23 >> 0x29 | uVar23 * 0x800000)) +
           (uVar23 & uVar21 ^ (uVar23 ^ 0xffffffffffffffff) & uVar19) + 0x6c44198c4a475817 +
           ((uVar39 >> 0x13 | uVar39 << 0x2d) ^ (uVar39 >> 0x3d | uVar39 * 8) ^ uVar39 >> 6) +
           uVar34 + ((uVar26 >> 1 | uVar26 << 0x3f) ^ (uVar26 >> 8 | uVar26 << 0x38) ^ uVar26 >> 7)
           + uVar41;
  *in_RDI = lVar17 + ((uVar22 >> 0x1c | uVar22 << 0x24) ^ (uVar22 >> 0x22 | uVar22 * 0x40000000) ^
                     (uVar22 >> 0x27 | uVar22 * 0x2000000)) +
                     (uVar22 & uVar20 ^ uVar22 & uVar18 ^ uVar20 & uVar18) + *in_RDI;
  in_RDI[1] = uVar22 + in_RDI[1];
  in_RDI[2] = uVar20 + in_RDI[2];
  in_RDI[3] = uVar18 + in_RDI[3];
  in_RDI[4] = uVar25 + lVar17 + in_RDI[4];
  in_RDI[5] = uVar23 + in_RDI[5];
  in_RDI[6] = uVar21 + in_RDI[6];
  in_RDI[7] = uVar19 + in_RDI[7];
  return;
}

Assistant:

static DECAF_NOINLINE void hashblock(decaf_sha512_ctx_t ctx) {
    const uint8_t *in = ctx->block;
    uint64_t a = ctx->state[0];
    uint64_t b = ctx->state[1];
    uint64_t c = ctx->state[2];
    uint64_t d = ctx->state[3];
    uint64_t e = ctx->state[4];
    uint64_t f = ctx->state[5];
    uint64_t g = ctx->state[6];
    uint64_t h = ctx->state[7];
    uint64_t T1;
    uint64_t T2;
    
    uint64_t w0  = load_bigendian(in +   0);
    uint64_t w1  = load_bigendian(in +   8);
    uint64_t w2  = load_bigendian(in +  16);
    uint64_t w3  = load_bigendian(in +  24);
    uint64_t w4  = load_bigendian(in +  32);
    uint64_t w5  = load_bigendian(in +  40);
    uint64_t w6  = load_bigendian(in +  48);
    uint64_t w7  = load_bigendian(in +  56);
    uint64_t w8  = load_bigendian(in +  64);
    uint64_t w9  = load_bigendian(in +  72);
    uint64_t w10 = load_bigendian(in +  80);
    uint64_t w11 = load_bigendian(in +  88);
    uint64_t w12 = load_bigendian(in +  96);
    uint64_t w13 = load_bigendian(in + 104);
    uint64_t w14 = load_bigendian(in + 112);
    uint64_t w15 = load_bigendian(in + 120);

    F(w0 ,0x428a2f98d728ae22ULL)
    F(w1 ,0x7137449123ef65cdULL)
    F(w2 ,0xb5c0fbcfec4d3b2fULL)
    F(w3 ,0xe9b5dba58189dbbcULL)
    F(w4 ,0x3956c25bf348b538ULL)
    F(w5 ,0x59f111f1b605d019ULL)
    F(w6 ,0x923f82a4af194f9bULL)
    F(w7 ,0xab1c5ed5da6d8118ULL)
    F(w8 ,0xd807aa98a3030242ULL)
    F(w9 ,0x12835b0145706fbeULL)
    F(w10,0x243185be4ee4b28cULL)
    F(w11,0x550c7dc3d5ffb4e2ULL)
    F(w12,0x72be5d74f27b896fULL)
    F(w13,0x80deb1fe3b1696b1ULL)
    F(w14,0x9bdc06a725c71235ULL)
    F(w15,0xc19bf174cf692694ULL)

    EXPAND

    F(w0 ,0xe49b69c19ef14ad2ULL)
    F(w1 ,0xefbe4786384f25e3ULL)
    F(w2 ,0x0fc19dc68b8cd5b5ULL)
    F(w3 ,0x240ca1cc77ac9c65ULL)
    F(w4 ,0x2de92c6f592b0275ULL)
    F(w5 ,0x4a7484aa6ea6e483ULL)
    F(w6 ,0x5cb0a9dcbd41fbd4ULL)
    F(w7 ,0x76f988da831153b5ULL)
    F(w8 ,0x983e5152ee66dfabULL)
    F(w9 ,0xa831c66d2db43210ULL)
    F(w10,0xb00327c898fb213fULL)
    F(w11,0xbf597fc7beef0ee4ULL)
    F(w12,0xc6e00bf33da88fc2ULL)
    F(w13,0xd5a79147930aa725ULL)
    F(w14,0x06ca6351e003826fULL)
    F(w15,0x142929670a0e6e70ULL)

    EXPAND

    F(w0 ,0x27b70a8546d22ffcULL)
    F(w1 ,0x2e1b21385c26c926ULL)
    F(w2 ,0x4d2c6dfc5ac42aedULL)
    F(w3 ,0x53380d139d95b3dfULL)
    F(w4 ,0x650a73548baf63deULL)
    F(w5 ,0x766a0abb3c77b2a8ULL)
    F(w6 ,0x81c2c92e47edaee6ULL)
    F(w7 ,0x92722c851482353bULL)
    F(w8 ,0xa2bfe8a14cf10364ULL)
    F(w9 ,0xa81a664bbc423001ULL)
    F(w10,0xc24b8b70d0f89791ULL)
    F(w11,0xc76c51a30654be30ULL)
    F(w12,0xd192e819d6ef5218ULL)
    F(w13,0xd69906245565a910ULL)
    F(w14,0xf40e35855771202aULL)
    F(w15,0x106aa07032bbd1b8ULL)

    EXPAND

    F(w0 ,0x19a4c116b8d2d0c8ULL)
    F(w1 ,0x1e376c085141ab53ULL)
    F(w2 ,0x2748774cdf8eeb99ULL)
    F(w3 ,0x34b0bcb5e19b48a8ULL)
    F(w4 ,0x391c0cb3c5c95a63ULL)
    F(w5 ,0x4ed8aa4ae3418acbULL)
    F(w6 ,0x5b9cca4f7763e373ULL)
    F(w7 ,0x682e6ff3d6b2b8a3ULL)
    F(w8 ,0x748f82ee5defb2fcULL)
    F(w9 ,0x78a5636f43172f60ULL)
    F(w10,0x84c87814a1f0ab72ULL)
    F(w11,0x8cc702081a6439ecULL)
    F(w12,0x90befffa23631e28ULL)
    F(w13,0xa4506cebde82bde9ULL)
    F(w14,0xbef9a3f7b2c67915ULL)
    F(w15,0xc67178f2e372532bULL)

    EXPAND

    F(w0 ,0xca273eceea26619cULL)
    F(w1 ,0xd186b8c721c0c207ULL)
    F(w2 ,0xeada7dd6cde0eb1eULL)
    F(w3 ,0xf57d4f7fee6ed178ULL)
    F(w4 ,0x06f067aa72176fbaULL)
    F(w5 ,0x0a637dc5a2c898a6ULL)
    F(w6 ,0x113f9804bef90daeULL)
    F(w7 ,0x1b710b35131c471bULL)
    F(w8 ,0x28db77f523047d84ULL)
    F(w9 ,0x32caab7b40c72493ULL)
    F(w10,0x3c9ebe0a15c9bebcULL)
    F(w11,0x431d67c49c100d4cULL)
    F(w12,0x4cc5d4becb3e42b6ULL)
    F(w13,0x597f299cfc657e2aULL)
    F(w14,0x5fcb6fab3ad6faecULL)
    F(w15,0x6c44198c4a475817ULL)
  
    ctx->state[0] += a;
    ctx->state[1] += b;
    ctx->state[2] += c;
    ctx->state[3] += d;
    ctx->state[4] += e;
    ctx->state[5] += f;
    ctx->state[6] += g;
    ctx->state[7] += h;
}